

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::MergeWireAssignmentsVisitor::create_new_assignment
               (StmtBlock *block,
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *stmts,Var *left,Var *right)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  Generator *pGVar4;
  pointer psVar5;
  undefined1 local_48 [8];
  shared_ptr<kratos::AssignStmt> new_stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((stmts->
      super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (stmts->
      super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)p_Var1,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &right->super_enable_shared_from_this<kratos::Var>);
    Var::assign((Var *)local_48,(shared_ptr<kratos::Var> *)left,(AssignmentType)p_Var1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    p_Var1 = &new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::AssignStmt,void>
              ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)p_Var1,
               (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    StmtBlock::add_stmt(block,(shared_ptr<kratos::Stmt> *)p_Var1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    pGVar4 = get_parent(block);
    if (pGVar4->debug == true) {
      psVar2 = (stmts->
               super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar5 = (stmts->
                    super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2;
          psVar5 = psVar5 + 1) {
        peVar3 = (psVar5->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&(((Stmt *)local_48)->super_IRNode).fn_name_ln,
                   (((Stmt *)local_48)->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (peVar3->super_Stmt).super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&(peVar3->super_Stmt).super_IRNode.fn_name_ln.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ._M_impl + 8));
      }
      new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_75dcce;
      local_30._M_pi._0_4_ = 0x1f7;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(((Stmt *)local_48)->super_IRNode).fn_name_ln,
                 (pair<const_char_*,_int> *)
                 &new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_stmt);
  }
  return;
}

Assistant:

static void create_new_assignment(StmtBlock* block,
                                      const std::vector<std::shared_ptr<AssignStmt>>& stmts,
                                      Var* const left, Var* const right) {
        if (stmts.empty()) return;
        // use the first assignment type. assume all the assignment has passed the
        // mixed assignment check
        auto new_stmt = left->assign(right->shared_from_this(), stmts[0]->assign_type());
        block->add_stmt(new_stmt);
        auto* generator = get_parent(block);
        if (generator->debug) {
            // merge all the statements
            for (auto const& stmt : stmts) {
                new_stmt->fn_name_ln.insert(new_stmt->fn_name_ln.end(), stmt->fn_name_ln.begin(),
                                            stmt->fn_name_ln.end());
            }
            new_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }